

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_CryptoError.h
# Opt level: O0

char * axl::cry::failWithLastCryptoError<char_const*>(char *failResult)

{
  char *in_RDI;
  
  setLastCryptoError();
  return in_RDI;
}

Assistant:

T
failWithLastCryptoError(T failResult) {
	setLastCryptoError();
	return failResult;
}